

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Mfs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  Sfm_Par_t *pPars;
  Sfm_Par_t Pars;
  int c;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Sfm_ParSetDefault((Sfm_Par_t *)((long)&pPars + 4));
  pPars._4_4_ = 5;
  Pars.nTfiLevMax = 100;
  Pars.nMffcMax = 2000;
  Extra_UtilGetoptReset();
LAB_002c2d40:
  Pars.fVerbose = Extra_UtilGetopt(argc,argv,"WFDMLCNdaebvwh");
  if (Pars.fVerbose == -1) {
    if (pAbc->pGia == (Gia_Man_t *)0x0) {
      Abc_Print(-1,"Abc_CommandAbc9Mfs(): There is no AIG.\n");
      return 0;
    }
    iVar2 = Gia_ManBufNum(pAbc->pGia);
    if (iVar2 != 0) {
      Abc_Print(-1,"Abc_CommandAbc9Mfs(): This command does not work with barrier buffers.\n");
      return 1;
    }
    iVar2 = Gia_ManHasMapping(pAbc->pGia);
    if (iVar2 == 0) {
      Abc_Print(-1,"Abc_CommandAbc9Mfs(): The current AIG has no mapping.\n");
      return 0;
    }
    iVar2 = Gia_ManLutSizeMax(pAbc->pGia);
    if (0xf < iVar2) {
      Abc_Print(-1,
                "Abc_CommandAbc9Mfs(): The current mapping has nodes with more than 15 inputs. Cannot use \"mfs\".\n"
               );
      return 0;
    }
    register0x00000000 = Gia_ManPerformMfs(pAbc->pGia,(Sfm_Par_t *)((long)&pPars + 4));
    Abc_FrameUpdateGia(pAbc,register0x00000000);
    return 0;
  }
  switch(Pars.fVerbose) {
  case 0x43:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
      goto LAB_002c3244;
    }
    Pars.nWinSizeMax = atoi(argv[globalUtilOptind]);
    uVar1 = Pars.nWinSizeMax;
    break;
  case 0x44:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-D\" should be followed by an integer.\n");
      goto LAB_002c3244;
    }
    Pars.nTfiLevMax = atoi(argv[globalUtilOptind]);
    uVar1 = Pars.nTfiLevMax;
    break;
  default:
    goto LAB_002c3244;
  case 0x46:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
      goto LAB_002c3244;
    }
    Pars.nTfoLevMax = atoi(argv[globalUtilOptind]);
    uVar1 = Pars.nTfoLevMax;
    break;
  case 0x4c:
    if (globalUtilOptind < argc) goto LAB_002c2f86;
    Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
    goto LAB_002c3244;
  case 0x4d:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
      goto LAB_002c3244;
    }
    Pars.nMffcMax = atoi(argv[globalUtilOptind]);
    uVar1 = Pars.nMffcMax;
    break;
  case 0x4e:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
      goto LAB_002c3244;
    }
    Pars.nGrowthLevel = atoi(argv[globalUtilOptind]);
    uVar1 = Pars.nGrowthLevel;
    break;
  case 0x57:
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
      goto LAB_002c3244;
    }
    pPars._4_4_ = atoi(argv[globalUtilOptind]);
    uVar1 = pPars._4_4_;
    break;
  case 0x61:
    Pars.DelAreaRatio = Pars.DelAreaRatio ^ 1;
    goto LAB_002c2d40;
  case 0x62:
    Pars.fUseSim = Pars.fUseSim ^ 1;
    goto LAB_002c2d40;
  case 100:
    Pars.DeltaCrit = Pars.DeltaCrit ^ 1;
    goto LAB_002c2d40;
  case 0x65:
    Pars.fArea = Pars.fArea ^ 1;
    goto LAB_002c2d40;
  case 0x68:
    goto LAB_002c3244;
  case 0x76:
    Pars.fLibVerbose = Pars.fLibVerbose ^ 1;
    goto LAB_002c2d40;
  case 0x77:
    Pars.fDelayVerbose = Pars.fDelayVerbose ^ 1;
    goto LAB_002c2d40;
  }
  globalUtilOptind = globalUtilOptind + 1;
  if ((int)uVar1 < 0) {
LAB_002c3244:
    Abc_Print(-2,"usage: &mfs [-WFDMLCN <num>] [-daebvwh]\n");
    Abc_Print(-2,"\t           performs don\'t-care-based optimization of logic networks\n");
    Abc_Print(-2,"\t-W <num> : the number of levels in the TFO cone (0 <= num) [default = %d]\n",
              (ulong)pPars._4_4_);
    Abc_Print(-2,"\t-F <num> : the max number of fanouts to skip (1 <= num) [default = %d]\n",
              (ulong)(uint)Pars.nTfoLevMax);
    Abc_Print(-2,"\t-D <num> : the max depth nodes to try (0 = no limit) [default = %d]\n",
              (ulong)(uint)Pars.nTfiLevMax);
    Abc_Print(-2,
              "\t-M <num> : the max node count of windows to consider (0 = no limit) [default = %d]\n"
              ,(ulong)(uint)Pars.nMffcMax);
    Abc_Print(-2,
              "\t-L <num> : the max increase in node level after resynthesis (0 <= num) [default = %d]\n"
              ,(ulong)(uint)Pars.nDecMax);
    Abc_Print(-2,
              "\t-C <num> : the max number of conflicts in one SAT run (0 = no limit) [default = %d]\n"
              ,(ulong)(uint)Pars.nWinSizeMax);
    Abc_Print(-2,"\t-N <num> : the max number of nodes to try (0 = all) [default = %d]\n",
              (ulong)(uint)Pars.nGrowthLevel);
    pcVar3 = "no";
    if (Pars.DeltaCrit != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-d       : toggle performing redundancy removal [default = %s]\n",pcVar3);
    pcVar3 = "area+edges";
    if (Pars.DelAreaRatio != 0) {
      pcVar3 = "area";
    }
    Abc_Print(-2,"\t-a       : toggle minimizing area or area+edges [default = %s]\n",pcVar3);
    pcVar3 = "no";
    if (Pars.fArea != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-e       : toggle high-effort resubstitution [default = %s]\n",pcVar3);
    pcVar3 = "no";
    if (Pars.fUseSim != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-b       : toggle preserving all white boxes [default = %s]\n",pcVar3);
    pcVar3 = "no";
    if (Pars.fLibVerbose != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar3);
    pcVar3 = "no";
    if (Pars.fDelayVerbose != 0) {
      pcVar3 = "yes";
    }
    Abc_Print(-2,"\t-w       : toggle printing detailed stats for each node [default = %s]\n",pcVar3
             );
    Abc_Print(-2,"\t-h       : print the command usage\n");
    return 1;
  }
  goto LAB_002c2d40;
LAB_002c2f86:
  Pars.nDecMax = atoi(argv[globalUtilOptind]);
  globalUtilOptind = globalUtilOptind + 1;
  if ((Pars.nDecMax < 0) || (1000000000 < Pars.nDecMax)) goto LAB_002c3244;
  goto LAB_002c2d40;
}

Assistant:

int Abc_CommandAbc9Mfs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManPerformMfs( Gia_Man_t * p, Sfm_Par_t * pPars );
    Gia_Man_t * pTemp; int c;
    Sfm_Par_t Pars, * pPars = &Pars;
    Sfm_ParSetDefault( pPars );
    pPars->nTfoLevMax  =    5;
    pPars->nDepthMax   =  100;
    pPars->nWinSizeMax = 2000;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WFDMLCNdaebvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTfoLevMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTfoLevMax < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFanoutMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFanoutMax < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nDepthMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nDepthMax < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWinSizeMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWinSizeMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nGrowthLevel = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nGrowthLevel < 0 || pPars->nGrowthLevel > ABC_INFINITY )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nNodesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nNodesMax < 0 )
                goto usage;
            break;
        case 'd':
            pPars->fRrOnly ^= 1;
            break;
        case 'a':
            pPars->fArea ^= 1;
            break;
        case 'e':
            pPars->fMoreEffort ^= 1;
            break;
        case 'b':
            pPars->fAllBoxes ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Mfs(): There is no AIG.\n" );
        return 0;
    }
    if ( Gia_ManBufNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Mfs(): This command does not work with barrier buffers.\n" );
        return 1;
    }
    if ( !Gia_ManHasMapping(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Mfs(): The current AIG has no mapping.\n" );
        return 0;
    }
    if ( Gia_ManLutSizeMax(pAbc->pGia) > 15 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Mfs(): The current mapping has nodes with more than 15 inputs. Cannot use \"mfs\".\n" );
        return 0;
    }
/*
    if ( pAbc->pGia->pAigExtra && Gia_ManPiNum(pAbc->pGia->pAigExtra) > 6 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Mfs(): The current white-boxes have more than 6 inputs. Cannot use \"mfs\".\n" );
        return 0;
    }
*/
    pTemp = Gia_ManPerformMfs( pAbc->pGia, pPars );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &mfs [-WFDMLCN <num>] [-daebvwh]\n" );
    Abc_Print( -2, "\t           performs don't-care-based optimization of logic networks\n" );
    Abc_Print( -2, "\t-W <num> : the number of levels in the TFO cone (0 <= num) [default = %d]\n",             pPars->nTfoLevMax );
    Abc_Print( -2, "\t-F <num> : the max number of fanouts to skip (1 <= num) [default = %d]\n",                pPars->nFanoutMax );
    Abc_Print( -2, "\t-D <num> : the max depth nodes to try (0 = no limit) [default = %d]\n",                   pPars->nDepthMax );
    Abc_Print( -2, "\t-M <num> : the max node count of windows to consider (0 = no limit) [default = %d]\n",    pPars->nWinSizeMax );
    Abc_Print( -2, "\t-L <num> : the max increase in node level after resynthesis (0 <= num) [default = %d]\n", pPars->nGrowthLevel );
    Abc_Print( -2, "\t-C <num> : the max number of conflicts in one SAT run (0 = no limit) [default = %d]\n",   pPars->nBTLimit );
    Abc_Print( -2, "\t-N <num> : the max number of nodes to try (0 = all) [default = %d]\n",                    pPars->nNodesMax );
    Abc_Print( -2, "\t-d       : toggle performing redundancy removal [default = %s]\n",                        pPars->fRrOnly? "yes": "no" );
    Abc_Print( -2, "\t-a       : toggle minimizing area or area+edges [default = %s]\n",                        pPars->fArea? "area": "area+edges" );
    Abc_Print( -2, "\t-e       : toggle high-effort resubstitution [default = %s]\n",                           pPars->fMoreEffort? "yes": "no" );
    Abc_Print( -2, "\t-b       : toggle preserving all white boxes [default = %s]\n",                           pPars->fAllBoxes? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n",                        pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggle printing detailed stats for each node [default = %s]\n",                pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}